

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedTest2_x_iutest_x_Mul2_Test,_iutest::detail::TypeList1<float>_>::
TypeParamTestInstance
          (TypeParamTestInstance<iu_TypedTest2_x_iutest_x_Mul2_Test,_iutest::detail::TypeList1<float>_>
           *this,string *testsuite,char *name,char *file,int line)

{
  EachTest<iutest::detail::TypeList1<float>,_void>::EachTest
            (&this->m_tests,testsuite,name,0,file,line);
  EachTest<iutest::detail::TypeList1<float>,_void>::AddTest(&this->m_tests);
  return;
}

Assistant:

TypeParamTestInstance(const std::string& testsuite, const char* name, const char* file, int line)
        : m_tests(testsuite, name, 0, file, line)
    {
        m_tests.AddTest();
    }